

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

Vec_Ptr_t * Gia_IsoDeriveEquivPos(Gia_Man_t *pGia,int fForward,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Gia_IsoMan_t *p;
  Vec_Ptr_t *pVVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  timespec *ptVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  timespec ts;
  timespec local_50;
  int local_3c;
  long local_38;
  
  local_3c = fVerbose;
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    local_38 = -1;
  }
  else {
    local_38 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  if (pGia->vCis->nSize < 1) {
    __assert_fail("Gia_ManCiNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x2d9,"Vec_Ptr_t *Gia_IsoDeriveEquivPos(Gia_Man_t *, int, int)");
  }
  if (pGia->vCos->nSize <= pGia->nRegs) {
    __assert_fail("Gia_ManPoNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x2da,"Vec_Ptr_t *Gia_IsoDeriveEquivPos(Gia_Man_t *, int, int)");
  }
  Gia_ManCleanValue(pGia);
  p = Gia_IsoManStart(pGia);
  Gia_IsoPrepare(p);
  Gia_IsoAssignUnique(p);
  ptVar12 = &local_50;
  iVar3 = clock_gettime(3,ptVar12);
  if (iVar3 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeStart = lVar11 + lVar10;
  if (local_3c != 0) {
    iVar3 = clock_gettime(3,&local_50);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    ptVar12 = (timespec *)0x0;
    Gia_IsoPrint(p,0,lVar10 - local_38);
  }
  if (fForward == 0) {
    iVar3 = 0;
    do {
      iVar4 = (int)ptVar12;
      if (p->vClasses->nSize < 1) break;
      bVar14 = true;
      if (iVar3 < 10000) {
        iVar4 = 0;
        uVar13 = 0;
        do {
          do {
            iVar5 = iVar3;
            iVar3 = clock_gettime(3,&local_50);
            if (iVar3 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
            }
            Gia_IsoSimulate(p,iVar5);
            iVar3 = clock_gettime(3,&local_50);
            if (iVar3 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
            }
            p->timeSim = p->timeSim + lVar11 + lVar10;
            iVar3 = clock_gettime(3,&local_50);
            if (iVar3 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
            }
            uVar7 = Gia_IsoSort(p);
            ptVar12 = &local_50;
            iVar3 = clock_gettime(3,ptVar12);
            if (iVar3 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
            }
            p->timeRefine = p->timeRefine + lVar11 + lVar10;
            if (local_3c != 0) {
              iVar3 = clock_gettime(3,&local_50);
              if (iVar3 < 0) {
                lVar10 = -1;
              }
              else {
                lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
              }
              ptVar12 = (timespec *)(ulong)(iVar5 + 1U);
              Gia_IsoPrint(p,iVar5 + 1U,lVar10 - local_38);
            }
            uVar13 = uVar13 | uVar7;
            iVar3 = iVar5 + 1;
            iVar4 = iVar4 + 1;
            if (uVar7 != 0) {
              iVar4 = 0;
            }
          } while ((iVar5 < 9999) && (iVar4 < 2));
          if (iVar5 < 9999) {
            iVar5 = 0;
            iVar4 = iVar3;
            do {
              iVar3 = clock_gettime(3,&local_50);
              if (iVar3 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
              }
              Gia_IsoSimulateBack(p,iVar4);
              iVar3 = clock_gettime(3,&local_50);
              if (iVar3 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
              }
              p->timeSim = p->timeSim + lVar11 + lVar10;
              iVar3 = clock_gettime(3,&local_50);
              if (iVar3 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
              }
              uVar7 = Gia_IsoSort(p);
              ptVar12 = &local_50;
              iVar3 = clock_gettime(3,ptVar12);
              if (iVar3 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
              }
              p->timeRefine = p->timeRefine + lVar11 + lVar10;
              if (local_3c != 0) {
                iVar3 = clock_gettime(3,&local_50);
                if (iVar3 < 0) {
                  lVar10 = -1;
                }
                else {
                  lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
                }
                ptVar12 = (timespec *)(ulong)(iVar4 + 1U);
                Gia_IsoPrint(p,iVar4 + 1U,lVar10 - local_38);
              }
              uVar13 = uVar13 | uVar7;
              iVar3 = iVar4 + 1;
              iVar5 = iVar5 + 1;
              if (uVar7 != 0) {
                iVar5 = 0;
              }
            } while ((iVar4 < 9999) && (iVar4 = iVar3, iVar5 < 2));
          }
          bVar14 = uVar13 != 0;
          if (9999 < iVar3) break;
          iVar4 = 0;
          bVar15 = uVar13 != 0;
          uVar13 = 0;
        } while (bVar15);
      }
      iVar4 = (int)ptVar12;
    } while (bVar14);
    if (0 < p->vClasses->nSize) {
      do {
        iVar4 = local_3c;
        Gia_IsoAssignOneClass(p,local_3c);
        if (iVar3 < 10000) {
          uVar13 = 0;
          do {
            do {
              iVar5 = iVar3;
              iVar3 = clock_gettime(3,&local_50);
              if (iVar3 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
              }
              Gia_IsoSimulateBack(p,iVar5);
              iVar3 = clock_gettime(3,&local_50);
              if (iVar3 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
              }
              p->timeSim = p->timeSim + lVar11 + lVar10;
              iVar3 = clock_gettime(3,&local_50);
              if (iVar3 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
              }
              uVar7 = Gia_IsoSort(p);
              ptVar12 = &local_50;
              iVar3 = clock_gettime(3,&local_50);
              iVar4 = (int)ptVar12;
              if (iVar3 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
              }
              p->timeRefine = p->timeRefine + lVar11 + lVar10;
              if (local_3c != 0) {
                iVar3 = clock_gettime(3,&local_50);
                if (iVar3 < 0) {
                  lVar10 = -1;
                }
                else {
                  lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
                }
                iVar4 = iVar5 + 1;
                Gia_IsoPrint(p,iVar4,lVar10 - local_38);
              }
              uVar13 = uVar13 | uVar7;
              iVar3 = iVar5 + 1;
            } while (iVar5 < 9999 && uVar7 != 0);
            iVar6 = iVar3;
            if (iVar5 < 9999) {
              do {
                iVar3 = clock_gettime(3,&local_50);
                if (iVar3 < 0) {
                  lVar10 = 1;
                }
                else {
                  lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
                  lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
                }
                Gia_IsoSimulate(p,iVar6);
                iVar3 = clock_gettime(3,&local_50);
                if (iVar3 < 0) {
                  lVar11 = -1;
                }
                else {
                  lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
                }
                p->timeSim = p->timeSim + lVar11 + lVar10;
                iVar3 = clock_gettime(3,&local_50);
                if (iVar3 < 0) {
                  lVar10 = 1;
                }
                else {
                  lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
                  lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
                }
                uVar7 = Gia_IsoSort(p);
                ptVar12 = &local_50;
                iVar3 = clock_gettime(3,&local_50);
                iVar4 = (int)ptVar12;
                if (iVar3 < 0) {
                  lVar11 = -1;
                }
                else {
                  lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
                }
                p->timeRefine = p->timeRefine + lVar11 + lVar10;
                if (local_3c != 0) {
                  iVar3 = clock_gettime(3,&local_50);
                  if (iVar3 < 0) {
                    lVar10 = -1;
                  }
                  else {
                    lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
                  }
                  iVar4 = iVar6 + 1;
                  Gia_IsoPrint(p,iVar4,lVar10 - local_38);
                }
                uVar13 = uVar13 | uVar7;
                iVar3 = iVar6 + 1;
              } while ((iVar6 < 9999) && (iVar6 = iVar3, uVar7 != 0));
            }
          } while ((iVar3 < 10000) && (bVar14 = uVar13 != 0, uVar13 = 0, bVar14));
        }
      } while (0 < p->vClasses->nSize);
    }
    if (local_3c == 0) goto LAB_0074fb1f;
    iVar4 = iVar3 + 2;
    iVar3 = clock_gettime(3,&local_50);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Gia_IsoPrint(p,iVar4,lVar10 - local_38);
  }
  else {
    iVar3 = 0;
    uVar13 = 0;
    do {
      iVar4 = clock_gettime(3,&local_50);
      if (iVar4 < 0) {
        lVar10 = 1;
      }
      else {
        lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
        lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
      }
      Gia_IsoSimulate(p,uVar13);
      iVar4 = clock_gettime(3,&local_50);
      if (iVar4 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->timeSim = p->timeSim + lVar11 + lVar10;
      iVar4 = clock_gettime(3,&local_50);
      if (iVar4 < 0) {
        lVar10 = 1;
      }
      else {
        lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
        lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
      }
      iVar5 = Gia_IsoSort(p);
      ptVar12 = &local_50;
      iVar6 = clock_gettime(3,&local_50);
      iVar4 = (int)ptVar12;
      if (iVar6 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->timeRefine = p->timeRefine + lVar11 + lVar10;
      if (local_3c != 0) {
        iVar4 = clock_gettime(3,&local_50);
        if (iVar4 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        iVar4 = uVar13 + 1;
        Gia_IsoPrint(p,iVar4,lVar10 - local_38);
      }
      iVar3 = iVar3 + 1;
      if (iVar5 != 0) {
        iVar3 = 0;
      }
    } while ((uVar13 < 9999) && (uVar13 = uVar13 + 1, iVar3 < 2));
  }
  if (local_3c != 0) {
    iVar5 = 3;
    iVar3 = clock_gettime(3,&local_50);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    p->timeTotal = lVar10 - local_38;
    p->timeOther = (lVar10 - local_38) - (p->timeStart + p->timeSim + p->timeRefine);
    Abc_Print(iVar5,"%s =","Start    ");
    dVar16 = 0.0;
    if (p->timeTotal != 0) {
      dVar16 = ((double)p->timeStart * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeStart / 1000000.0,dVar16);
    Abc_Print(iVar5,"%s =","Simulate ");
    dVar16 = 0.0;
    if (p->timeTotal != 0) {
      dVar16 = ((double)p->timeSim * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeSim / 1000000.0,dVar16);
    Abc_Print(iVar5,"%s =","Refine   ");
    dVar17 = (double)(p->timeRefine - p->timeSort);
    dVar16 = 0.0;
    if (p->timeTotal != 0) {
      dVar16 = (dVar17 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",dVar17 / 1000000.0,dVar16);
    Abc_Print(iVar5,"%s =","Sort     ");
    dVar16 = 0.0;
    if (p->timeTotal != 0) {
      dVar16 = ((double)p->timeSort * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeSort / 1000000.0,dVar16);
    Abc_Print(iVar5,"%s =","Other    ");
    dVar16 = 0.0;
    if (p->timeTotal != 0) {
      dVar16 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar16);
    Abc_Print(iVar5,"%s =","TOTAL    ");
    dVar16 = (double)p->timeTotal;
    dVar17 = 0.0;
    if (p->timeTotal != 0) {
      dVar17 = (dVar16 * 100.0) / dVar16;
    }
    iVar4 = 0x98a657;
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",dVar16 / 1000000.0,dVar17);
  }
LAB_0074fb1f:
  if (p->pGia->vCos->nSize - p->pGia->nRegs < 2) {
    pVVar8 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar8 = Gia_IsoCollectCosClasses(p,iVar4);
  }
  lVar10 = (long)p->pGia->nObjs;
  if ((0 < lVar10) && (pGVar1 = p->pGia->pObjs, pGVar1 != (Gia_Obj_t *)0x0)) {
    piVar2 = p->pUniques;
    puVar9 = &pGVar1->Value;
    lVar11 = 0;
    do {
      *puVar9 = piVar2[lVar11];
      lVar11 = lVar11 + 1;
      puVar9 = puVar9 + 3;
    } while (lVar10 != lVar11);
  }
  Gia_IsoManStop(p);
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Gia_IsoDeriveEquivPos( Gia_Man_t * pGia, int fForward, int fVerbose )
{
    int nIterMax = 10000;
    int nFixedPoint = 1;
    Gia_IsoMan_t * p;
    Vec_Ptr_t * vEquivs = NULL;
    int fRefined, fRefinedAll;
    int i, c;
    abctime clk = Abc_Clock(), clkTotal = Abc_Clock();
    assert( Gia_ManCiNum(pGia) > 0 );
    assert( Gia_ManPoNum(pGia) > 0 );

    Gia_ManCleanValue( pGia );
    p = Gia_IsoManStart( pGia );
    Gia_IsoPrepare( p );
    Gia_IsoAssignUnique( p );
    p->timeStart = Abc_Clock() - clk;
    if ( fVerbose )
        Gia_IsoPrint( p, 0, Abc_Clock() - clkTotal );

//    Gia_IsoRecognizeMuxes( pGia );

    i = 0;
    if ( fForward )
    {
        for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
        {
            clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
            clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
            if ( fVerbose )
                Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
        }
    }
    else
    {
        while ( Vec_IntSize(p->vClasses) > 0 )
        {
            for ( fRefinedAll = 1; i < nIterMax && fRefinedAll; )
            {
                fRefinedAll = 0;
                for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
                for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulateBack( p, i );  p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
            }
            if ( !fRefinedAll )
                break;
        }

//        Gia_IsoReportTopmost( p );

        while ( Vec_IntSize(p->vClasses) > 0 )
        {
            Gia_IsoAssignOneClass( p, fVerbose );
            for ( fRefinedAll = 1; i < nIterMax && fRefinedAll; )
            {
                fRefinedAll = 0;
                for ( c = 0; i < nIterMax && c < nFixedPoint; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulateBack( p, i );  p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
                for ( c = 0; i < nIterMax && c < nFixedPoint; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
//                    if ( fRefined )
//                        printf( "Refinedment happened.\n" );
                }
            }
        }

        if ( fVerbose )
            Gia_IsoPrint( p, i+2, Abc_Clock() - clkTotal );
    }
//    Gia_IsoPrintClasses( p );
    if ( fVerbose )
    {
        p->timeTotal = Abc_Clock() - clkTotal;
        p->timeOther = p->timeTotal - p->timeStart - p->timeSim - p->timeRefine;
        ABC_PRTP( "Start    ", p->timeStart,              p->timeTotal );
        ABC_PRTP( "Simulate ", p->timeSim,                p->timeTotal );
        ABC_PRTP( "Refine   ", p->timeRefine-p->timeSort, p->timeTotal );
        ABC_PRTP( "Sort     ", p->timeSort,               p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther,              p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal,              p->timeTotal );
    }

    if ( Gia_ManPoNum(p->pGia) > 1 )
        vEquivs = Gia_IsoCollectCosClasses( p, fVerbose );
    Gia_IsoManTransferUnique( p );
    Gia_IsoManStop( p );

    return vEquivs;
}